

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scala_file.hpp
# Opt level: O1

void __thiscall scala::scale::scale(scale *this)

{
  iterator __position;
  degree *__args;
  
  (this->degrees).super__Vector_base<scala::degree,_std::allocator<scala::degree>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->degrees).super__Vector_base<scala::degree,_std::allocator<scala::degree>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->degrees).super__Vector_base<scala::degree,_std::allocator<scala::degree>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __args = (degree *)operator_new(8);
  __args->ratio = 1.0;
  __position._M_current =
       (this->degrees).super__Vector_base<scala::degree,_std::allocator<scala::degree>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->degrees).super__Vector_base<scala::degree,_std::allocator<scala::degree>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<scala::degree,std::allocator<scala::degree>>::
    _M_realloc_insert<scala::degree_const&>
              ((vector<scala::degree,std::allocator<scala::degree>> *)this,__position,__args);
  }
  else {
    (__position._M_current)->ratio = __args->ratio;
    (this->degrees).super__Vector_base<scala::degree,_std::allocator<scala::degree>_>._M_impl.
    super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  return;
}

Assistant:

scale () {
            // The first degree is a scala file is always implicit. Make it explicit.
            degrees.push_back( *(new degree(0.0)));
        }